

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

entry_type __thiscall fasttext::Dictionary::getType(Dictionary *this,int32_t id)

{
  if (id < 0) {
    __assert_fail("id >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/dictionary.cc"
                  ,0x8c,"entry_type fasttext::Dictionary::getType(int32_t) const");
  }
  if (id < this->size_) {
    return (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_start[(uint)id].type;
  }
  __assert_fail("id < size_",
                "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/dictionary.cc"
                ,0x8d,"entry_type fasttext::Dictionary::getType(int32_t) const");
}

Assistant:

entry_type Dictionary::getType(int32_t id) const {
  assert(id >= 0);
  assert(id < size_);
  return words_[id].type;
}